

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O1

void __thiscall
Balk::add_concentrated_power(Balk *this,int shift,double segment_length,double value)

{
  undefined1 local_49;
  ConcentratedPower *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  int local_34;
  shared_ptr<Term> local_30;
  double local_20;
  double local_18;
  
  local_48 = (ConcentratedPower *)0x0;
  local_34 = shift;
  local_20 = value;
  local_18 = segment_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ConcentratedPower,std::allocator<ConcentratedPower>,int&,double&,double&>
            (&_Stack_40,&local_48,(allocator<ConcentratedPower> *)&local_49,&local_34,&local_18,
             &local_20);
  local_30.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_48->super_Term;
  local_30.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_40._M_pi;
  local_48 = (ConcentratedPower *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)&this->terms,
             &local_30);
  if (local_30.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  return;
}

Assistant:

void Balk::add_concentrated_power(int shift, double segment_length, double value)
{
    terms.push_back(std::make_shared<ConcentratedPower>(shift, segment_length, value));
}